

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareQuantify(Odc_Man_t *p)

{
  Odc_Lit_t OVar1;
  Odc_Lit_t iFan1;
  int iVar2;
  uint uVar3;
  int local_24;
  int i;
  uint uData;
  Odc_Lit_t uRes1;
  Odc_Lit_t uRes0;
  Odc_Man_t *p_local;
  
  if (0xfffe < p->iRoot) {
    __assert_fail("p->iRoot < 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x312,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
  }
  iVar2 = Vec_PtrSize(p->vBranches);
  if (iVar2 < 0x21) {
    local_24 = 0;
    while( true ) {
      iVar2 = Vec_PtrSize(p->vBranches);
      if (iVar2 <= local_24) {
        if (p->nObjs <= p->nObjsAlloc) {
          return 1;
        }
        __assert_fail("p->nObjs <= p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                      ,0x321,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
      }
      Odc_ManIncrementTravId(p);
      OVar1 = Odc_Regular(p->iRoot);
      uVar3 = Abc_NtkDontCareCofactors_rec(p,OVar1,1 << ((byte)local_24 & 0x1f));
      iVar2 = Odc_IsComplement(p->iRoot);
      OVar1 = Odc_NotCond((Odc_Lit_t)uVar3,iVar2);
      iVar2 = Odc_IsComplement(p->iRoot);
      iFan1 = Odc_NotCond((Odc_Lit_t)(uVar3 >> 0x10),iVar2);
      OVar1 = Odc_Or(p,OVar1,iFan1);
      p->iRoot = OVar1;
      iVar2 = Odc_ObjNum(p);
      if (0x4000 < iVar2) break;
      local_24 = local_24 + 1;
    }
    return 0;
  }
  __assert_fail("Vec_PtrSize(p->vBranches) <= 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                ,0x313,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
}

Assistant:

int Abc_NtkDontCareQuantify( Odc_Man_t * p )
{   
    Odc_Lit_t uRes0, uRes1;
    unsigned uData;
    int i;
    assert( p->iRoot < 0xffff );
    assert( Vec_PtrSize(p->vBranches) <= 32 ); // the mask size
    for ( i = 0; i < Vec_PtrSize(p->vBranches); i++ )
    {
        // compute the cofactors w.r.t. this variable
        Odc_ManIncrementTravId( p );
        uData = Abc_NtkDontCareCofactors_rec( p, Odc_Regular(p->iRoot), (1 << i) );
        uRes0 = Odc_NotCond( (Odc_Lit_t)(uData & 0xffff), Odc_IsComplement(p->iRoot) );
        uRes1 = Odc_NotCond( (Odc_Lit_t)(uData >> 16),    Odc_IsComplement(p->iRoot) );
        // quantify this variable existentially
        p->iRoot = Odc_Or( p, uRes0, uRes1 );
        // check the limit
        if ( Odc_ObjNum(p) > ABC_DC_MAX_NODES/2 )
            return 0;
    }
    assert( p->nObjs <= p->nObjsAlloc );
    return 1;
}